

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O2

void __thiscall
chrono::ChDirectSolverLS::WriteMatrix(ChDirectSolverLS *this,string *filename,ChSparseMatrix *M)

{
  long lVar1;
  ChStreamOutAscii *pCVar2;
  int j;
  long col;
  long row;
  Scalar dVal;
  ChStreamOutAsciiFile file;
  
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file,(filename->_M_dataplus)._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file.super_ChStreamOutAscii,"%.12g");
  lVar1 = 0;
  while (row = lVar1, row < M->m_outerSize) {
    for (col = 0; lVar1 = row + 1, col < M->m_innerSize; col = col + 1) {
      dVal = Eigen::SparseMatrix<double,_1,_int>::coeff(M,row,col);
      if (((dVal != 0.0) || (NAN(dVal))) ||
         ((M->m_outerSize + -1 == row && (col == M->m_innerSize + -1)))) {
        pCVar2 = ChStreamOutAscii::operator<<(&file.super_ChStreamOutAscii,(int)(row + 1));
        pCVar2 = ChStreamOutAscii::operator<<(pCVar2," ");
        pCVar2 = ChStreamOutAscii::operator<<(pCVar2,(int)col + 1);
        pCVar2 = ChStreamOutAscii::operator<<(pCVar2," ");
        pCVar2 = ChStreamOutAscii::operator<<(pCVar2,dVal);
        ChStreamOutAscii::operator<<(pCVar2,"\n");
      }
    }
  }
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file);
  return;
}

Assistant:

void ChDirectSolverLS::WriteMatrix(const std::string& filename, const ChSparseMatrix& M) {
    ChStreamOutAsciiFile file(filename.c_str());
    file.SetNumFormat("%.12g");
    for (int i = 0; i < M.rows(); i++) {
        for (int j = 0; j < M.cols(); j++) {
            double elVal = M.coeff(i, j);
            if (elVal || (i == M.rows() - 1 && j == M.cols() - 1)) {
                file << i + 1 << " " << j + 1 << " " << elVal << "\n";
            }
        }
    }
}